

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureLevelCase::test
          (TextureLevelCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  GLenum pname;
  TestLog *pTVar1;
  uint expected;
  CallLogWrapper *pCVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  deUint32 dVar6;
  ScopedLogSection *this_00;
  int iVar7;
  long lVar8;
  allocator<char> local_131;
  ResultCollector *local_130;
  GLint ref;
  CallLogWrapper *local_120;
  ScopedLogSection section_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  ScopedLogSection section_2;
  ScopedLogSection section;
  string local_78;
  int local_54;
  float local_50;
  GLuint uRef;
  Random rnd;
  
  tester = (this->super_TextureTest).m_tester;
  local_130 = result;
  bVar3 = isPureIntTester(tester);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = isPureUintTester(tester);
  }
  GVar5 = (this->super_TextureTest).m_pname;
  expected = 0;
  if (GVar5 != 0x813c) {
    expected = -(uint)(GVar5 != 0x813d) | 1000;
  }
  if (bVar4 == false) {
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Initial",(allocator<char> *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Initial",(allocator<char> *)&local_78);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    StateQueryUtil::verifyStateTextureParamInteger
              (local_130,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               expected,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
  }
  if (((this->super_TextureTest).m_target | 2) == 0x9102) {
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Set",(allocator<char> *)&section);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Set",(allocator<char> *)&local_100);
    tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    glu::CallLogWrapper::glTexParameteri
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0);
    GVar5 = glu::CallLogWrapper::glGetError(gl);
    if (GVar5 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Got Error ",(allocator<char> *)&section_2);
      rnd.m_rnd._0_8_ = glu::getErrorName;
      rnd.m_rnd.z = GVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&rnd);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     &local_100,&local_78);
      std::operator+(&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     ": ");
      std::operator+(&local_c0,&local_e0,"glTexParameteri");
      tcu::ResultCollector::fail(local_130,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_100);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_130,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
               (this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterf
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0.0);
    GVar5 = glu::CallLogWrapper::glGetError(gl);
    if (GVar5 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Got Error ",(allocator<char> *)&section_2);
      rnd.m_rnd._0_8_ = glu::getErrorName;
      rnd.m_rnd.z = GVar5;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&rnd);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     &local_100,&local_78);
      std::operator+(&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     ": ");
      std::operator+(&local_c0,&local_e0,"glTexParameterf");
      tcu::ResultCollector::fail(local_130,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_100);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_130,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
               (this->super_TextureTest).m_type);
    this_00 = &section_1;
  }
  else {
    pTVar1 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"Set",(allocator<char> *)&section);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Set",(allocator<char> *)&local_100);
    tcu::ScopedLogSection::ScopedLogSection(&section_2,pTVar1,&local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    deRandom_init(&rnd.m_rnd,0xabcdef);
    local_120 = gl;
    if (bVar4 == false) {
      iVar7 = 0x14;
      while (bVar3 = iVar7 != 0, iVar7 = iVar7 + -1, bVar3) {
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        glu::CallLogWrapper::glTexParameteri
                  (local_120,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   dVar6 % 0xfa01);
        GVar5 = glu::CallLogWrapper::glGetError(local_120);
        if (GVar5 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"Got Error ",(allocator<char> *)&ref);
          section_1.m_log = (TestLog *)glu::getErrorName;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&section_1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &section,&local_100,&local_78);
          std::operator+(&local_e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &section,": ");
          std::operator+(&local_c0,&local_e0,"glTexParameteri");
          tcu::ResultCollector::fail(local_130,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&section);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_100);
        }
        StateQueryUtil::verifyStateTextureParamInteger
                  (local_130,local_120,(this->super_TextureTest).m_target,
                   (this->super_TextureTest).m_pname,dVar6 % 0xfa01,(this->super_TextureTest).m_type
                  );
      }
      for (iVar7 = 0; iVar7 != 0x1e; iVar7 = iVar7 + 1) {
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        local_54 = dVar6 % 64000 + 1;
        local_50 = (float)local_54;
        for (lVar8 = 0; pCVar2 = local_120, lVar8 != 0x10; lVar8 = lVar8 + 4) {
          glu::CallLogWrapper::glTexParameterf
                    (local_120,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                     *(float *)((long)&DAT_019044b0 + lVar8) + local_50);
          GVar5 = glu::CallLogWrapper::glGetError(pCVar2);
          if (GVar5 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,"Got Error ",(allocator<char> *)&ref);
            section_1.m_log = (TestLog *)glu::getErrorName;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&section_1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &section,&local_100,&local_78);
            std::operator+(&local_e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &section,": ");
            std::operator+(&local_c0,&local_e0,"glTexParameterf");
            tcu::ResultCollector::fail(local_130,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&section);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&local_100);
          }
          StateQueryUtil::verifyStateTextureParamInteger
                    (local_130,local_120,(this->super_TextureTest).m_target,
                     (this->super_TextureTest).m_pname,local_54,(this->super_TextureTest).m_type);
        }
      }
    }
    else {
      iVar7 = 0x14;
      while (bVar3 = iVar7 != 0, iVar7 = iVar7 + -1, bVar3) {
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        ref = dVar6 % 0xfa01;
        uRef = ref;
        bVar3 = isPureIntTester((this->super_TextureTest).m_tester);
        pCVar2 = local_120;
        GVar5 = (this->super_TextureTest).m_target;
        pname = (this->super_TextureTest).m_pname;
        if (bVar3) {
          glu::CallLogWrapper::glTexParameterIiv(local_120,GVar5,pname,&ref);
          GVar5 = glu::CallLogWrapper::glGetError(pCVar2);
          if (GVar5 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,"Got Error ",&local_131);
            section_1.m_log = (TestLog *)glu::getErrorName;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&section_1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &section,&local_100,&local_78);
            std::operator+(&local_e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &section,": ");
            std::operator+(&local_c0,&local_e0,"glTexParameterIiv");
            tcu::ResultCollector::fail(local_130,&local_c0);
LAB_014dec1b:
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&section);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&local_100);
          }
        }
        else {
          glu::CallLogWrapper::glTexParameterIuiv(local_120,GVar5,pname,&uRef);
          GVar5 = glu::CallLogWrapper::glGetError(pCVar2);
          if (GVar5 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,"Got Error ",&local_131);
            section_1.m_log = (TestLog *)glu::getErrorName;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&section_1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &section,&local_100,&local_78);
            std::operator+(&local_e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &section,": ");
            std::operator+(&local_c0,&local_e0,"glTexParameterIuiv");
            tcu::ResultCollector::fail(local_130,&local_c0);
            goto LAB_014dec1b;
          }
        }
        StateQueryUtil::verifyStateTextureParamInteger
                  (local_130,local_120,(this->super_TextureTest).m_target,
                   (this->super_TextureTest).m_pname,ref,(this->super_TextureTest).m_type);
      }
    }
    this_00 = &section_2;
  }
  tcu::ScopedLogSection::~ScopedLogSection(this_00);
  return;
}

Assistant:

void TextureLevelCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool	isPureCase		= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const int	initialValue	= (m_pname == GL_TEXTURE_BASE_LEVEL) ? (0)
								: (m_pname == GL_TEXTURE_MAX_LEVEL)	? (1000)
								: (-1);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initialValue, m_type);
	}

	if (m_target == GL_TEXTURE_2D_MULTISAMPLE		||
		m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		// only 0 allowed
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "Set", "Set");

			gl.glTexParameteri(m_target, m_pname, 0);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");
			verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);

			gl.glTexParameterf(m_target, m_pname, 0.0f);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");
			verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);
		}
	}
	else
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const int					numIterations	= 20;
		de::Random					rnd				(0xabcdef);

		if (isPureCase)
		{
			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLint		ref		= rnd.getInt(0, 64000);
				const GLuint	uRef	= (glw::GLuint)ref;

				if (isPureIntTester(m_tester))
				{
					gl.glTexParameterIiv(m_target, m_pname, &ref);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));
					gl.glTexParameterIuiv(m_target, m_pname, &uRef);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, ref, m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLint ref = rnd.getInt(0, 64000);

				gl.glTexParameteri(m_target, m_pname, ref);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, ref, m_type);
			}

			// check unit conversions with float

			const float nonSignificantOffsets[] = {-0.45f, -0.25f, 0, 0.45f}; // offsets O so that for any integers z in Z, o in O roundToClosestInt(z+o)==z

			const int numConversionIterations = 30;
			for (int ndx = 0; ndx < numConversionIterations; ++ndx)
			{
				const GLint ref = rnd.getInt(1, 64000);

				for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(nonSignificantOffsets); ++offsetNdx)
				{
					gl.glTexParameterf(m_target, m_pname, ((GLfloat)ref) + nonSignificantOffsets[offsetNdx]);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

					verifyStateTextureParamInteger(result, gl, m_target, m_pname, ref, m_type);
				}
			}
		}
	}
}